

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sslexeme.cpp
# Opt level: O2

int IsStringFloat(char *str)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  size_t sVar4;
  int i;
  size_t sVar5;
  int i_1;
  ulong uVar6;
  
  if (str == (char *)0x0) {
    return 0;
  }
  if (*str != '\0') {
    sVar4 = strlen(str);
    sVar5 = 0;
    do {
      if (sVar4 == sVar5) {
        sVar5 = 0;
        bVar2 = false;
        while( true ) {
          if (sVar4 == sVar5) {
            uVar6 = 1;
            do {
              if (sVar4 <= uVar6) {
                return (uint)bVar2;
              }
              pcVar1 = str + uVar6;
              uVar6 = uVar6 + 1;
            } while (*pcVar1 != '-');
            return 0;
          }
          bVar3 = bVar2;
          if ((str[sVar5] == '.') && (bVar3 = true, bVar2)) break;
          bVar2 = bVar3;
          sVar5 = sVar5 + 1;
        }
        return 0;
      }
      pcVar1 = str + sVar5;
      sVar5 = sVar5 + 1;
    } while ((byte)(*pcVar1 - 0x2dU) < 2 || (byte)(*pcVar1 - 0x30U) < 10);
    return 0;
  }
  return 0;
}

Assistant:

int IsStringFloat(const char* str)
{
    if (!str)
        return FALSE;

    if (strlen(str) == 0)
        return FALSE;

    for (int i = 0; i < strlen(str); i++)
    {
        if (!IsCharNumeric(str[i]) && str[i] != '-' && str[i] != '.')
            return FALSE;
    }

    int isRadixPointFound = 0;
    for (int i = 0; i < strlen(str); i++)
    {
        if (str[i] == '.')
        {
            if (isRadixPointFound)
                return FALSE;
            else
                isRadixPointFound = 1;
        }
    }

    for (int i = 1; i < strlen(str); i++)
    {
        if (str[i] == '-')
            return FALSE;
    }

    if (isRadixPointFound)
        return TRUE;
    else
        return FALSE;
}